

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::CreateFramework
          (cmOSXBundleGenerator *this,string *targetName,string *outpath,string *config,
          SkipParts *skipParts)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  bool bVar2;
  cmAlphaNum local_6a0;
  cmAlphaNum local_670;
  string local_640;
  _Self local_620;
  allocator<char> local_611;
  key_type local_610;
  _Self local_5f0;
  Status local_5e8;
  Status local_5e0;
  cmAlphaNum local_5d8;
  cmAlphaNum local_5a8;
  string local_578;
  _Self local_558;
  allocator<char> local_549;
  key_type local_548;
  _Self local_528;
  Status local_520;
  Status local_518;
  cmAlphaNum local_510;
  cmAlphaNum local_4e0;
  string local_4b0;
  _Self local_490;
  allocator<char> local_481;
  key_type local_480;
  _Self local_460;
  Status local_458;
  Status local_450;
  cmAlphaNum local_448;
  cmAlphaNum local_418;
  string local_3e8;
  cmAlphaNum local_3c8;
  cmAlphaNum local_398;
  string local_368;
  Status local_348;
  Status local_340;
  cmAlphaNum local_338;
  cmAlphaNum local_308;
  string local_2d8;
  Status local_2b8;
  Status local_2b0;
  cmAlphaNum local_2a8;
  cmAlphaNum local_278;
  undefined1 local_248 [8];
  string versions;
  string newName;
  string oldName;
  allocator<char> local_1c9;
  value_type local_1c8;
  undefined1 local_1a8 [8];
  string plist;
  string name;
  string frameworkVersion;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [8];
  string newoutpath;
  char local_d1;
  string local_d0;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string contentdir;
  SkipParts *skipParts_local;
  string *config_local;
  string *outpath_local;
  string *targetName_local;
  cmOSXBundleGenerator *this_local;
  
  contentdir.field_2._8_8_ = skipParts;
  bVar2 = MustSkip(this);
  if (!bVar2) {
    if (this->MacContentFolders ==
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      __assert_fail("this->MacContentFolders",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmOSXBundleGenerator.cxx"
                    ,0x42,
                    "void cmOSXBundleGenerator::CreateFramework(const std::string &, const std::string &, const std::string &, const cmOSXBundleGenerator::SkipParts &)"
                   );
    }
    cmAlphaNum::cmAlphaNum(&local_80,outpath);
    cmAlphaNum::cmAlphaNum(&local_b0,'/');
    cmGeneratorTarget::GetFrameworkDirectory(&local_d0,this->GT,config,ContentLevel);
    local_d1 = '/';
    cmStrCat<std::__cxx11::string,char>((string *)local_50,&local_80,&local_b0,&local_d0,&local_d1);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator+(&local_128,outpath,"/");
    cmGeneratorTarget::GetFrameworkDirectory
              ((string *)((long)&frameworkVersion.field_2 + 8),this->GT,config,FullLevel);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   &local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&frameworkVersion.field_2 + 8));
    std::__cxx11::string::~string((string *)(frameworkVersion.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_128);
    cmGeneratorTarget::GetFrameworkVersion_abi_cxx11_((string *)((long)&name.field_2 + 8),this->GT);
    cmsys::SystemTools::GetFilenameName((string *)((long)&plist.field_2 + 8),targetName);
    if ((*(byte *)contentdir.field_2._8_8_ & 1) == 0) {
      std::__cxx11::string::string((string *)local_1a8,(string *)local_108);
      bVar2 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
      if (!bVar2) {
        psVar1 = this->MacContentFolders;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,"Resources",&local_1c9);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(psVar1,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
        std::__cxx11::string::operator+=((string *)local_1a8,"/Resources");
      }
      std::__cxx11::string::operator+=((string *)local_1a8,"/Info.plist");
      cmLocalGenerator::GenerateFrameworkInfoPList
                (this->LocalGenerator,this->GT,(string *)((long)&plist.field_2 + 8),
                 (string *)local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
    }
    bVar2 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
    if (!bVar2) {
      std::__cxx11::string::string((string *)(newName.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(versions.field_2._M_local_buf + 8));
      cmAlphaNum::cmAlphaNum(&local_278,(string *)local_50);
      cmAlphaNum::cmAlphaNum(&local_2a8,"Versions");
      cmStrCat<>((string *)local_248,&local_278,&local_2a8);
      local_2b0 = cmsys::SystemTools::MakeDirectory((string *)local_248,(mode_t *)0x0);
      local_2b8 = cmsys::SystemTools::MakeDirectory((string *)local_108,(mode_t *)0x0);
      std::__cxx11::string::operator=
                ((string *)(newName.field_2._M_local_buf + 8),
                 (string *)(name.field_2._M_local_buf + 8));
      cmAlphaNum::cmAlphaNum(&local_308,(string *)local_248);
      cmAlphaNum::cmAlphaNum(&local_338,"/Current");
      cmStrCat<>(&local_2d8,&local_308,&local_338);
      std::__cxx11::string::operator=
                ((string *)(versions.field_2._M_local_buf + 8),(string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      local_340 = cmsys::SystemTools::RemoveFile((string *)(versions.field_2._M_local_buf + 8));
      local_348 = cmSystemTools::CreateSymlink
                            ((string *)((long)&newName.field_2 + 8),
                             (string *)((long)&versions.field_2 + 8));
      cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      cmAlphaNum::cmAlphaNum(&local_398,"Versions/Current/");
      cmAlphaNum::cmAlphaNum(&local_3c8,(string *)((long)&plist.field_2 + 8));
      cmStrCat<>(&local_368,&local_398,&local_3c8);
      std::__cxx11::string::operator=
                ((string *)(newName.field_2._M_local_buf + 8),(string *)&local_368);
      std::__cxx11::string::~string((string *)&local_368);
      cmAlphaNum::cmAlphaNum(&local_418,(string *)local_50);
      cmAlphaNum::cmAlphaNum(&local_448,(string *)((long)&plist.field_2 + 8));
      cmStrCat<>(&local_3e8,&local_418,&local_448);
      std::__cxx11::string::operator=
                ((string *)(versions.field_2._M_local_buf + 8),(string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_3e8);
      local_450 = cmsys::SystemTools::RemoveFile((string *)(versions.field_2._M_local_buf + 8));
      local_458 = cmSystemTools::CreateSymlink
                            ((string *)((long)&newName.field_2 + 8),
                             (string *)((long)&versions.field_2 + 8));
      cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      psVar1 = this->MacContentFolders;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_480,"Resources",&local_481);
      local_460._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(psVar1,&local_480);
      local_490._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this->MacContentFolders);
      bVar2 = std::operator!=(&local_460,&local_490);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator(&local_481);
      if (bVar2) {
        std::__cxx11::string::operator=
                  ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/Resources");
        cmAlphaNum::cmAlphaNum(&local_4e0,(string *)local_50);
        cmAlphaNum::cmAlphaNum(&local_510,"Resources");
        cmStrCat<>(&local_4b0,&local_4e0,&local_510);
        std::__cxx11::string::operator=
                  ((string *)(versions.field_2._M_local_buf + 8),(string *)&local_4b0);
        std::__cxx11::string::~string((string *)&local_4b0);
        local_518 = cmsys::SystemTools::RemoveFile((string *)(versions.field_2._M_local_buf + 8));
        local_520 = cmSystemTools::CreateSymlink
                              ((string *)((long)&newName.field_2 + 8),
                               (string *)((long)&versions.field_2 + 8));
        cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      }
      psVar1 = this->MacContentFolders;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"Headers",&local_549);
      local_528._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(psVar1,&local_548);
      local_558._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this->MacContentFolders);
      bVar2 = std::operator!=(&local_528,&local_558);
      std::__cxx11::string::~string((string *)&local_548);
      std::allocator<char>::~allocator(&local_549);
      if (bVar2) {
        std::__cxx11::string::operator=
                  ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/Headers");
        cmAlphaNum::cmAlphaNum(&local_5a8,(string *)local_50);
        cmAlphaNum::cmAlphaNum(&local_5d8,"Headers");
        cmStrCat<>(&local_578,&local_5a8,&local_5d8);
        std::__cxx11::string::operator=
                  ((string *)(versions.field_2._M_local_buf + 8),(string *)&local_578);
        std::__cxx11::string::~string((string *)&local_578);
        local_5e0 = cmsys::SystemTools::RemoveFile((string *)(versions.field_2._M_local_buf + 8));
        local_5e8 = cmSystemTools::CreateSymlink
                              ((string *)((long)&newName.field_2 + 8),
                               (string *)((long)&versions.field_2 + 8));
        cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      }
      psVar1 = this->MacContentFolders;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_610,"PrivateHeaders",&local_611);
      local_5f0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(psVar1,&local_610);
      local_620._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this->MacContentFolders);
      bVar2 = std::operator!=(&local_5f0,&local_620);
      std::__cxx11::string::~string((string *)&local_610);
      std::allocator<char>::~allocator(&local_611);
      if (bVar2) {
        std::__cxx11::string::operator=
                  ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/PrivateHeaders");
        cmAlphaNum::cmAlphaNum(&local_670,(string *)local_50);
        cmAlphaNum::cmAlphaNum(&local_6a0,"PrivateHeaders");
        cmStrCat<>(&local_640,&local_670,&local_6a0);
        std::__cxx11::string::operator=
                  ((string *)(versions.field_2._M_local_buf + 8),(string *)&local_640);
        std::__cxx11::string::~string((string *)&local_640);
        cmsys::SystemTools::RemoveFile((string *)(versions.field_2._M_local_buf + 8));
        cmSystemTools::CreateSymlink
                  ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
        cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
      }
      std::__cxx11::string::~string((string *)local_248);
      std::__cxx11::string::~string((string *)(versions.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(newName.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)(plist.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_108);
    std::__cxx11::string::~string((string *)local_50);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateFramework(
  const std::string& targetName, const std::string& outpath,
  const std::string& config, const cmOSXBundleGenerator::SkipParts& skipParts)
{
  if (this->MustSkip()) {
    return;
  }

  assert(this->MacContentFolders);

  // Compute the location of the top-level foo.framework directory.
  std::string contentdir = cmStrCat(
    outpath, '/',
    this->GT->GetFrameworkDirectory(config, cmGeneratorTarget::ContentLevel),
    '/');

  std::string newoutpath = outpath + "/" +
    this->GT->GetFrameworkDirectory(config, cmGeneratorTarget::FullLevel);

  std::string frameworkVersion = this->GT->GetFrameworkVersion();

  std::string name = cmSystemTools::GetFilenameName(targetName);
  if (!skipParts.infoPlist) {
    // Configure the Info.plist file
    std::string plist = newoutpath;
    if (!this->Makefile->PlatformIsAppleEmbedded()) {
      // Put the Info.plist file into the Resources directory.
      this->MacContentFolders->insert("Resources");
      plist += "/Resources";
    }
    plist += "/Info.plist";
    this->LocalGenerator->GenerateFrameworkInfoPList(this->GT, name, plist);
  }

  // Generate Versions directory only for MacOSX frameworks
  if (this->Makefile->PlatformIsAppleEmbedded()) {
    return;
  }

  // TODO: Use the cmMakefileTargetGenerator::ExtraFiles vector to
  // drive rules to create these files at build time.
  std::string oldName;
  std::string newName;

  // Make foo.framework/Versions
  std::string versions = cmStrCat(contentdir, "Versions");
  cmSystemTools::MakeDirectory(versions);

  // Make foo.framework/Versions/version
  cmSystemTools::MakeDirectory(newoutpath);

  // Current -> version
  oldName = frameworkVersion;
  newName = cmStrCat(versions, "/Current");
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // foo -> Versions/Current/foo
  oldName = cmStrCat("Versions/Current/", name);
  newName = cmStrCat(contentdir, name);
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // Resources -> Versions/Current/Resources
  if (this->MacContentFolders->find("Resources") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Resources";
    newName = cmStrCat(contentdir, "Resources");
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // Headers -> Versions/Current/Headers
  if (this->MacContentFolders->find("Headers") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/Headers";
    newName = cmStrCat(contentdir, "Headers");
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }

  // PrivateHeaders -> Versions/Current/PrivateHeaders
  if (this->MacContentFolders->find("PrivateHeaders") !=
      this->MacContentFolders->end()) {
    oldName = "Versions/Current/PrivateHeaders";
    newName = cmStrCat(contentdir, "PrivateHeaders");
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
  }
}